

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  string *psVar1;
  TestProperty *pTVar2;
  Message *pMVar3;
  int i;
  string local_90;
  string local_70;
  pointer local_50;
  string *local_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Message attributes;
  
  local_48 = __return_storage_ptr__;
  Message::Message((Message *)&local_40);
  for (i = 0; psVar1 = local_48,
      i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                       (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                             _vptr_TestEventListener) >> 6); i = i + 1) {
    pTVar2 = TestResult::GetTestProperty((TestResult *)this,i);
    std::operator<<((ostream *)(local_40.ptr_ + 0x10)," ");
    local_50 = (pTVar2->key_)._M_dataplus._M_p;
    pMVar3 = Message::operator<<((Message *)&local_40,&local_50);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x143024);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x1418ad);
    std::__cxx11::string::string
              ((string *)&local_70,(pTVar2->value_)._M_dataplus._M_p,
               (allocator *)((long)&attributes.ss_.ptr_ + 7));
    EscapeXmlAttribute(&local_90,&local_70);
    pMVar3 = Message::operator<<(pMVar3,&local_90);
    Message::operator<<(pMVar3,(char (*) [2])0x1418ad);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  StringStreamToString(local_48,local_40.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  return psVar1;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}